

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLoop.cpp
# Opt level: O0

void __thiscall loop::MessageLoop::~MessageLoop(MessageLoop *this)

{
  SharedSemaphore *this_00;
  TaskInfo *pTVar1;
  bool bVar2;
  TaskInfo *local_18;
  TaskInfo *task;
  MessageLoop *this_local;
  
  task = (TaskInfo *)this;
  while (bVar2 = moodycamel::
                 ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
                 ::try_dequeue<loop::MessageLoop::TaskInfo*>
                           ((ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
                             *)&this->m_quque,&local_18), pTVar1 = local_18, bVar2) {
    if (local_18 != (TaskInfo *)0x0) {
      TaskInfo::~TaskInfo(local_18);
      operator_delete(pTVar1);
    }
  }
  this_00 = this->m_sem;
  if (this_00 != (SharedSemaphore *)0x0) {
    myutils::SharedSemaphore::~SharedSemaphore(this_00);
    operator_delete(this_00);
  }
  moodycamel::
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::
  ~ConcurrentQueue(&this->m_quque);
  moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
  ~ConcurrentQueue(&this->m_deleted_queue);
  return;
}

Assistant:

MessageLoop::~MessageLoop()
{
    TaskInfo* task;
    while (m_quque.try_dequeue(task)) delete task;
    delete m_sem;
}